

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  uint uVar49;
  undefined1 (*pauVar50) [16];
  undefined4 uVar51;
  ulong uVar52;
  long lVar53;
  byte *pbVar54;
  byte *pbVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  undefined1 (*pauVar61) [16];
  ulong uVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar69 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  float fVar100;
  undefined1 auVar99 [64];
  uint uVar102;
  uint uVar103;
  uint uVar104;
  undefined1 auVar101 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined1 local_2670 [8];
  float fStack_2668;
  float fStack_2664;
  int local_2654;
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  long local_2618;
  ulong local_2610;
  RayQueryContext *local_2608;
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  long local_25d8;
  int *local_25d0;
  byte *local_25c8;
  RTCRayQueryContext *local_25c0;
  RayHit *local_25b8;
  float *local_25b0;
  undefined4 local_25a8;
  float local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  float local_2594;
  float local_2590;
  undefined4 local_258c;
  uint local_2588;
  uint local_2584;
  uint local_2580;
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  float local_24b0 [4];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar61 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar85 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar94._8_4_ = 0x7fffffff;
    auVar94._0_8_ = 0x7fffffff7fffffff;
    auVar94._12_4_ = 0x7fffffff;
    auVar94 = vandps_avx((undefined1  [16])aVar2,auVar94);
    auVar95._8_4_ = 0x219392ef;
    auVar95._0_8_ = 0x219392ef219392ef;
    auVar95._12_4_ = 0x219392ef;
    auVar94 = vcmpps_avx(auVar94,auVar95,1);
    auVar94 = vblendvps_avx((undefined1  [16])aVar2,auVar95,auVar94);
    auVar95 = vrcpps_avx(auVar94);
    fVar63 = auVar95._0_4_;
    auVar91._0_4_ = auVar94._0_4_ * fVar63;
    fVar70 = auVar95._4_4_;
    auVar91._4_4_ = auVar94._4_4_ * fVar70;
    fVar71 = auVar95._8_4_;
    auVar91._8_4_ = auVar94._8_4_ * fVar71;
    fVar72 = auVar95._12_4_;
    auVar91._12_4_ = auVar94._12_4_ * fVar72;
    auVar96._8_4_ = 0x3f800000;
    auVar96._0_8_ = 0x3f8000003f800000;
    auVar96._12_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar96,auVar91);
    auVar92._0_4_ = fVar63 + fVar63 * auVar94._0_4_;
    auVar92._4_4_ = fVar70 + fVar70 * auVar94._4_4_;
    auVar92._8_4_ = fVar71 + fVar71 * auVar94._8_4_;
    auVar92._12_4_ = fVar72 + fVar72 * auVar94._12_4_;
    uVar51 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar51;
    local_23c0._0_4_ = uVar51;
    local_23c0._8_4_ = uVar51;
    local_23c0._12_4_ = uVar51;
    local_23c0._16_4_ = uVar51;
    local_23c0._20_4_ = uVar51;
    local_23c0._24_4_ = uVar51;
    local_23c0._28_4_ = uVar51;
    auVar98 = ZEXT3264(local_23c0);
    uVar51 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar51;
    local_23e0._0_4_ = uVar51;
    local_23e0._8_4_ = uVar51;
    local_23e0._12_4_ = uVar51;
    local_23e0._16_4_ = uVar51;
    local_23e0._20_4_ = uVar51;
    local_23e0._24_4_ = uVar51;
    local_23e0._28_4_ = uVar51;
    auVar99 = ZEXT3264(local_23e0);
    uVar51 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar51;
    local_2400._0_4_ = uVar51;
    local_2400._8_4_ = uVar51;
    local_2400._12_4_ = uVar51;
    local_2400._16_4_ = uVar51;
    local_2400._20_4_ = uVar51;
    local_2400._24_4_ = uVar51;
    local_2400._28_4_ = uVar51;
    auVar101 = ZEXT3264(local_2400);
    auVar94 = vshufps_avx(auVar92,auVar92,0);
    local_2420._16_16_ = auVar94;
    local_2420._0_16_ = auVar94;
    auVar105 = ZEXT3264(local_2420);
    auVar94 = vmovshdup_avx(auVar92);
    auVar95 = vshufps_avx(auVar92,auVar92,0x55);
    local_2440._16_16_ = auVar95;
    local_2440._0_16_ = auVar95;
    auVar106 = ZEXT3264(local_2440);
    auVar95 = vshufpd_avx(auVar92,auVar92,1);
    auVar91 = vshufps_avx(auVar92,auVar92,0xaa);
    local_2460._16_16_ = auVar91;
    local_2460._0_16_ = auVar91;
    auVar111 = ZEXT3264(local_2460);
    uVar59 = (ulong)(auVar92._0_4_ < 0.0) << 5;
    uVar57 = (ulong)(auVar94._0_4_ < 0.0) << 5 | 0x40;
    uVar58 = (ulong)(auVar95._0_4_ < 0.0) << 5 | 0x80;
    uVar60 = uVar59 ^ 0x20;
    auVar94 = vshufps_avx(auVar73,auVar73,0);
    local_2480._16_16_ = auVar94;
    local_2480._0_16_ = auVar94;
    auVar112 = ZEXT3264(local_2480);
    auVar94 = vshufps_avx(auVar85,auVar85,0);
    auVar69 = ZEXT3264(CONCAT1616(auVar94,auVar94));
    local_2550 = mm_lookupmask_ps._240_8_;
    uStack_2548 = mm_lookupmask_ps._248_8_;
LAB_00e525f6:
    if (pauVar61 != (undefined1 (*) [16])&local_23a0) {
      pauVar50 = pauVar61 + -1;
      pauVar61 = pauVar61 + -1;
      if (*(float *)(*pauVar50 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar52 = *(ulong *)*pauVar61;
        while ((uVar52 & 8) == 0) {
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar59),auVar98._0_32_);
          auVar17._4_4_ = auVar105._4_4_ * auVar16._4_4_;
          auVar17._0_4_ = auVar105._0_4_ * auVar16._0_4_;
          auVar17._8_4_ = auVar105._8_4_ * auVar16._8_4_;
          auVar17._12_4_ = auVar105._12_4_ * auVar16._12_4_;
          auVar17._16_4_ = auVar105._16_4_ * auVar16._16_4_;
          auVar17._20_4_ = auVar105._20_4_ * auVar16._20_4_;
          auVar17._24_4_ = auVar105._24_4_ * auVar16._24_4_;
          auVar17._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar57),auVar99._0_32_);
          auVar19._4_4_ = auVar106._4_4_ * auVar16._4_4_;
          auVar19._0_4_ = auVar106._0_4_ * auVar16._0_4_;
          auVar19._8_4_ = auVar106._8_4_ * auVar16._8_4_;
          auVar19._12_4_ = auVar106._12_4_ * auVar16._12_4_;
          auVar19._16_4_ = auVar106._16_4_ * auVar16._16_4_;
          auVar19._20_4_ = auVar106._20_4_ * auVar16._20_4_;
          auVar19._24_4_ = auVar106._24_4_ * auVar16._24_4_;
          auVar19._28_4_ = auVar16._28_4_;
          auVar16 = vmaxps_avx(auVar17,auVar19);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar58),auVar101._0_32_);
          auVar20._4_4_ = auVar111._4_4_ * auVar17._4_4_;
          auVar20._0_4_ = auVar111._0_4_ * auVar17._0_4_;
          auVar20._8_4_ = auVar111._8_4_ * auVar17._8_4_;
          auVar20._12_4_ = auVar111._12_4_ * auVar17._12_4_;
          auVar20._16_4_ = auVar111._16_4_ * auVar17._16_4_;
          auVar20._20_4_ = auVar111._20_4_ * auVar17._20_4_;
          auVar20._24_4_ = auVar111._24_4_ * auVar17._24_4_;
          auVar20._28_4_ = auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar20,auVar112._0_32_);
          local_2540 = vmaxps_avx(auVar16,auVar17);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar60),auVar98._0_32_);
          auVar21._4_4_ = auVar105._4_4_ * auVar16._4_4_;
          auVar21._0_4_ = auVar105._0_4_ * auVar16._0_4_;
          auVar21._8_4_ = auVar105._8_4_ * auVar16._8_4_;
          auVar21._12_4_ = auVar105._12_4_ * auVar16._12_4_;
          auVar21._16_4_ = auVar105._16_4_ * auVar16._16_4_;
          auVar21._20_4_ = auVar105._20_4_ * auVar16._20_4_;
          auVar21._24_4_ = auVar105._24_4_ * auVar16._24_4_;
          auVar21._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar57 ^ 0x20)),
                               auVar99._0_32_);
          auVar22._4_4_ = auVar106._4_4_ * auVar16._4_4_;
          auVar22._0_4_ = auVar106._0_4_ * auVar16._0_4_;
          auVar22._8_4_ = auVar106._8_4_ * auVar16._8_4_;
          auVar22._12_4_ = auVar106._12_4_ * auVar16._12_4_;
          auVar22._16_4_ = auVar106._16_4_ * auVar16._16_4_;
          auVar22._20_4_ = auVar106._20_4_ * auVar16._20_4_;
          auVar22._24_4_ = auVar106._24_4_ * auVar16._24_4_;
          auVar22._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar21,auVar22);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar58 ^ 0x20)),
                               auVar101._0_32_);
          auVar23._4_4_ = auVar111._4_4_ * auVar17._4_4_;
          auVar23._0_4_ = auVar111._0_4_ * auVar17._0_4_;
          auVar23._8_4_ = auVar111._8_4_ * auVar17._8_4_;
          auVar23._12_4_ = auVar111._12_4_ * auVar17._12_4_;
          auVar23._16_4_ = auVar111._16_4_ * auVar17._16_4_;
          auVar23._20_4_ = auVar111._20_4_ * auVar17._20_4_;
          auVar23._24_4_ = auVar111._24_4_ * auVar17._24_4_;
          auVar23._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar23,auVar69._0_32_);
          auVar16 = vminps_avx(auVar16,auVar17);
          auVar16 = vcmpps_avx(local_2540,auVar16,2);
          uVar49 = vmovmskps_avx(auVar16);
          if (uVar49 == 0) goto LAB_00e525f6;
          uVar49 = uVar49 & 0xff;
          uVar62 = uVar52 & 0xfffffffffffffff0;
          lVar53 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar52 = *(ulong *)(uVar62 + lVar53 * 8);
          uVar49 = uVar49 - 1 & uVar49;
          if (uVar49 != 0) {
            uVar102 = *(uint *)(local_2540 + lVar53 * 4);
            lVar53 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar62 + lVar53 * 8);
            uVar103 = *(uint *)(local_2540 + lVar53 * 4);
            uVar49 = uVar49 - 1 & uVar49;
            if (uVar49 == 0) {
              if (uVar102 < uVar103) {
                *(ulong *)*pauVar61 = uVar5;
                *(uint *)(*pauVar61 + 8) = uVar103;
                pauVar61 = pauVar61 + 1;
              }
              else {
                *(ulong *)*pauVar61 = uVar52;
                *(uint *)(*pauVar61 + 8) = uVar102;
                pauVar61 = pauVar61 + 1;
                uVar52 = uVar5;
              }
            }
            else {
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar52;
              auVar94 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar102));
              auVar85._8_8_ = 0;
              auVar85._0_8_ = uVar5;
              auVar73 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar103));
              lVar53 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(uVar62 + lVar53 * 8);
              auVar95 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_2540 + lVar53 * 4)));
              auVar85 = vpcmpgtd_avx(auVar73,auVar94);
              uVar49 = uVar49 - 1 & uVar49;
              if (uVar49 == 0) {
                auVar91 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar73,auVar94,auVar91);
                auVar94 = vblendvps_avx(auVar94,auVar73,auVar91);
                auVar73 = vpcmpgtd_avx(auVar95,auVar85);
                auVar91 = vpshufd_avx(auVar73,0xaa);
                auVar73 = vblendvps_avx(auVar95,auVar85,auVar91);
                auVar85 = vblendvps_avx(auVar85,auVar95,auVar91);
                auVar95 = vpcmpgtd_avx(auVar85,auVar94);
                auVar91 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar85,auVar94,auVar91);
                auVar94 = vblendvps_avx(auVar94,auVar85,auVar91);
                *pauVar61 = auVar94;
                pauVar61[1] = auVar95;
                uVar52 = auVar73._0_8_;
                pauVar61 = pauVar61 + 2;
              }
              else {
                lVar53 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                  }
                }
                auVar97._8_8_ = 0;
                auVar97._0_8_ = *(ulong *)(uVar62 + lVar53 * 8);
                auVar91 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_2540 + lVar53 * 4)));
                uVar49 = uVar49 - 1 & uVar49;
                uVar52 = (ulong)uVar49;
                if (uVar49 == 0) {
                  auVar92 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar73,auVar94,auVar92);
                  auVar94 = vblendvps_avx(auVar94,auVar73,auVar92);
                  auVar73 = vpcmpgtd_avx(auVar91,auVar95);
                  auVar92 = vpshufd_avx(auVar73,0xaa);
                  auVar73 = vblendvps_avx(auVar91,auVar95,auVar92);
                  auVar95 = vblendvps_avx(auVar95,auVar91,auVar92);
                  auVar91 = vpcmpgtd_avx(auVar95,auVar94);
                  auVar92 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar95,auVar94,auVar92);
                  auVar94 = vblendvps_avx(auVar94,auVar95,auVar92);
                  auVar95 = vpcmpgtd_avx(auVar73,auVar85);
                  auVar92 = vpshufd_avx(auVar95,0xaa);
                  auVar95 = vblendvps_avx(auVar73,auVar85,auVar92);
                  auVar73 = vblendvps_avx(auVar85,auVar73,auVar92);
                  auVar85 = vpcmpgtd_avx(auVar91,auVar73);
                  auVar92 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar91,auVar73,auVar92);
                  auVar73 = vblendvps_avx(auVar73,auVar91,auVar92);
                  *pauVar61 = auVar94;
                  pauVar61[1] = auVar73;
                  pauVar61[2] = auVar85;
                  uVar52 = auVar95._0_8_;
                  pauVar61 = pauVar61 + 3;
                }
                else {
                  *pauVar61 = auVar94;
                  pauVar61[1] = auVar73;
                  pauVar61[2] = auVar95;
                  pauVar50 = pauVar61 + 3;
                  pauVar61[3] = auVar91;
                  do {
                    lVar53 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                      }
                    }
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = *(ulong *)(uVar62 + lVar53 * 8);
                    auVar94 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_2540 + lVar53 * 4)));
                    pauVar50[1] = auVar94;
                    pauVar50 = pauVar50 + 1;
                    uVar52 = uVar52 & uVar52 - 1;
                  } while (uVar52 != 0);
                  lVar53 = 0;
                  while (pauVar50 != pauVar61) {
                    auVar94 = pauVar61[1];
                    uVar49 = vextractps_avx(auVar94,2);
                    for (lVar56 = 0x10;
                        (lVar53 != lVar56 && (*(uint *)(pauVar61[-1] + lVar56 + 8) < uVar49));
                        lVar56 = lVar56 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar61 + lVar56) =
                           *(undefined1 (*) [16])(pauVar61[-1] + lVar56);
                    }
                    *(undefined1 (*) [16])(*pauVar61 + lVar56) = auVar94;
                    lVar53 = lVar53 + -0x10;
                    pauVar61 = pauVar61 + 1;
                  }
                  uVar52 = *(ulong *)*pauVar50;
                  pauVar61 = pauVar50;
                }
              }
            }
          }
        }
        lVar53 = (ulong)((uint)uVar52 & 0xf) - 8;
        uVar52 = uVar52 & 0xfffffffffffffff0;
        for (local_25d8 = 0; local_25d8 != lVar53; local_25d8 = local_25d8 + 1) {
          lVar56 = local_25d8 * 0xb0;
          pfVar1 = (float *)(uVar52 + 0x80 + lVar56);
          fVar24 = *pfVar1;
          fVar25 = pfVar1[1];
          fVar26 = pfVar1[2];
          fVar27 = pfVar1[3];
          pfVar1 = (float *)(uVar52 + 0x40 + lVar56);
          fVar28 = *pfVar1;
          fVar29 = pfVar1[1];
          fVar30 = pfVar1[2];
          fVar31 = pfVar1[3];
          auVar64._0_4_ = fVar24 * fVar28;
          auVar64._4_4_ = fVar25 * fVar29;
          auVar64._8_4_ = fVar26 * fVar30;
          auVar64._12_4_ = fVar27 * fVar31;
          pfVar1 = (float *)(uVar52 + 0x70 + lVar56);
          fVar32 = *pfVar1;
          fVar33 = pfVar1[1];
          fVar34 = pfVar1[2];
          fVar35 = pfVar1[3];
          pfVar1 = (float *)(uVar52 + 0x50 + lVar56);
          fVar36 = *pfVar1;
          fVar37 = pfVar1[1];
          fVar38 = pfVar1[2];
          fVar39 = pfVar1[3];
          auVar75._0_4_ = fVar32 * fVar36;
          auVar75._4_4_ = fVar33 * fVar37;
          auVar75._8_4_ = fVar34 * fVar38;
          auVar75._12_4_ = fVar35 * fVar39;
          auVar85 = vsubps_avx(auVar75,auVar64);
          pfVar1 = (float *)(uVar52 + 0x60 + lVar56);
          fVar40 = *pfVar1;
          fVar41 = pfVar1[1];
          fVar42 = pfVar1[2];
          fVar43 = pfVar1[3];
          auVar76._0_4_ = fVar40 * fVar36;
          auVar76._4_4_ = fVar41 * fVar37;
          auVar76._8_4_ = fVar42 * fVar38;
          auVar76._12_4_ = fVar43 * fVar39;
          pfVar1 = (float *)(uVar52 + 0x30 + lVar56);
          fVar44 = *pfVar1;
          fVar45 = pfVar1[1];
          fVar46 = pfVar1[2];
          fVar47 = pfVar1[3];
          auVar86._0_4_ = fVar24 * fVar44;
          auVar86._4_4_ = fVar25 * fVar45;
          auVar86._8_4_ = fVar26 * fVar46;
          auVar86._12_4_ = fVar27 * fVar47;
          local_2640 = vsubps_avx(auVar86,auVar76);
          auVar87._0_4_ = fVar32 * fVar44;
          auVar87._4_4_ = fVar33 * fVar45;
          auVar87._8_4_ = fVar34 * fVar46;
          auVar87._12_4_ = fVar35 * fVar47;
          auVar107._0_4_ = fVar40 * fVar28;
          auVar107._4_4_ = fVar41 * fVar29;
          auVar107._8_4_ = fVar42 * fVar30;
          auVar107._12_4_ = fVar43 * fVar31;
          auVar95 = vsubps_avx(auVar107,auVar87);
          uVar51 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar108._4_4_ = uVar51;
          auVar108._0_4_ = uVar51;
          auVar108._8_4_ = uVar51;
          auVar108._12_4_ = uVar51;
          local_25f0 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + lVar56),auVar108);
          uVar51 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar109._4_4_ = uVar51;
          auVar109._0_4_ = uVar51;
          auVar109._8_4_ = uVar51;
          auVar109._12_4_ = uVar51;
          local_2600 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x10 + lVar56),auVar109);
          uVar51 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar110._4_4_ = uVar51;
          auVar110._0_4_ = uVar51;
          auVar110._8_4_ = uVar51;
          auVar110._12_4_ = uVar51;
          local_2650 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + lVar56),auVar110);
          fVar63 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar70 = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar72 = local_2650._0_4_;
          auVar113._0_4_ = fVar63 * fVar72;
          fVar7 = local_2650._4_4_;
          auVar113._4_4_ = fVar63 * fVar7;
          fVar10 = local_2650._8_4_;
          auVar113._8_4_ = fVar63 * fVar10;
          fVar13 = local_2650._12_4_;
          auVar113._12_4_ = fVar63 * fVar13;
          fVar100 = local_2600._0_4_;
          auVar114._0_4_ = fVar70 * fVar100;
          fVar8 = local_2600._4_4_;
          auVar114._4_4_ = fVar70 * fVar8;
          fVar11 = local_2600._8_4_;
          auVar114._8_4_ = fVar70 * fVar11;
          fVar14 = local_2600._12_4_;
          auVar114._12_4_ = fVar70 * fVar14;
          auVar73 = vsubps_avx(auVar114,auVar113);
          fVar71 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar6 = local_25f0._0_4_;
          auVar65._0_4_ = fVar70 * fVar6;
          fVar9 = local_25f0._4_4_;
          auVar65._4_4_ = fVar70 * fVar9;
          fVar12 = local_25f0._8_4_;
          auVar65._8_4_ = fVar70 * fVar12;
          fVar15 = local_25f0._12_4_;
          auVar65._12_4_ = fVar70 * fVar15;
          auVar77._0_4_ = fVar71 * fVar72;
          auVar77._4_4_ = fVar71 * fVar7;
          auVar77._8_4_ = fVar71 * fVar10;
          auVar77._12_4_ = fVar71 * fVar13;
          auVar91 = vsubps_avx(auVar77,auVar65);
          auVar78._0_4_ = fVar71 * fVar100;
          auVar78._4_4_ = fVar71 * fVar8;
          auVar78._8_4_ = fVar71 * fVar11;
          auVar78._12_4_ = fVar71 * fVar14;
          auVar88._0_4_ = fVar63 * fVar6;
          auVar88._4_4_ = fVar63 * fVar9;
          auVar88._8_4_ = fVar63 * fVar12;
          auVar88._12_4_ = fVar63 * fVar15;
          auVar92 = vsubps_avx(auVar88,auVar78);
          local_2670._0_4_ = auVar85._0_4_;
          local_2670._4_4_ = auVar85._4_4_;
          fStack_2668 = auVar85._8_4_;
          fStack_2664 = auVar85._12_4_;
          auVar89._0_4_ =
               (float)local_2670._0_4_ * fVar71 + fVar63 * local_2640._0_4_ + fVar70 * auVar95._0_4_
          ;
          auVar89._4_4_ =
               (float)local_2670._4_4_ * fVar71 + fVar63 * local_2640._4_4_ + fVar70 * auVar95._4_4_
          ;
          auVar89._8_4_ = fStack_2668 * fVar71 + fVar63 * local_2640._8_4_ + fVar70 * auVar95._8_4_;
          auVar89._12_4_ =
               fStack_2664 * fVar71 + fVar63 * local_2640._12_4_ + fVar70 * auVar95._12_4_;
          auVar79._8_8_ = 0x8000000080000000;
          auVar79._0_8_ = 0x8000000080000000;
          auVar94 = vandps_avx(auVar89,auVar79);
          uVar49 = auVar94._0_4_;
          local_2540._0_4_ =
               (float)(uVar49 ^ (uint)(fVar40 * auVar73._0_4_ +
                                      fVar24 * auVar92._0_4_ + fVar32 * auVar91._0_4_));
          uVar102 = auVar94._4_4_;
          local_2540._4_4_ =
               (float)(uVar102 ^
                      (uint)(fVar41 * auVar73._4_4_ +
                            fVar25 * auVar92._4_4_ + fVar33 * auVar91._4_4_));
          uVar103 = auVar94._8_4_;
          local_2540._8_4_ =
               (float)(uVar103 ^
                      (uint)(fVar42 * auVar73._8_4_ +
                            fVar26 * auVar92._8_4_ + fVar34 * auVar91._8_4_));
          uVar104 = auVar94._12_4_;
          local_2540._12_4_ =
               (float)(uVar104 ^
                      (uint)(fVar43 * auVar73._12_4_ +
                            fVar27 * auVar92._12_4_ + fVar35 * auVar91._12_4_));
          local_2540._16_4_ =
               (float)(uVar49 ^ (uint)(fVar44 * auVar73._0_4_ +
                                      fVar36 * auVar92._0_4_ + fVar28 * auVar91._0_4_));
          local_2540._20_4_ =
               (float)(uVar102 ^
                      (uint)(fVar45 * auVar73._4_4_ +
                            fVar37 * auVar92._4_4_ + fVar29 * auVar91._4_4_));
          local_2540._24_4_ =
               (float)(uVar103 ^
                      (uint)(fVar46 * auVar73._8_4_ +
                            fVar38 * auVar92._8_4_ + fVar30 * auVar91._8_4_));
          local_2540._28_4_ =
               (float)(uVar104 ^
                      (uint)(fVar47 * auVar73._12_4_ +
                            fVar39 * auVar92._12_4_ + fVar31 * auVar91._12_4_));
          auVar91 = ZEXT416(0) << 0x20;
          auVar94 = vcmpps_avx(local_2540._0_16_,auVar91,5);
          auVar73 = vcmpps_avx(local_2540._16_16_,auVar91,5);
          auVar94 = vandps_avx(auVar94,auVar73);
          auVar80._8_4_ = 0x7fffffff;
          auVar80._0_8_ = 0x7fffffff7fffffff;
          auVar80._12_4_ = 0x7fffffff;
          local_2510 = vandps_avx(auVar89,auVar80);
          auVar73 = vcmpps_avx(auVar91,auVar89,4);
          auVar94 = vandps_avx(auVar94,auVar73);
          auVar81._0_4_ = local_2540._0_4_ + local_2540._16_4_;
          auVar81._4_4_ = local_2540._4_4_ + local_2540._20_4_;
          auVar81._8_4_ = local_2540._8_4_ + local_2540._24_4_;
          auVar81._12_4_ = local_2540._12_4_ + local_2540._28_4_;
          auVar73 = vcmpps_avx(auVar81,local_2510,2);
          auVar94 = vandps_avx(auVar94,auVar73);
          auVar18._8_8_ = uStack_2548;
          auVar18._0_8_ = local_2550;
          auVar18 = auVar18 & auVar94;
          if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar18[0xf] < '\0') {
            auVar48._8_8_ = uStack_2548;
            auVar48._0_8_ = local_2550;
            auVar94 = vandps_avx(auVar94,auVar48);
            local_2520._0_4_ =
                 (float)(uVar49 ^ (uint)((float)local_2670._0_4_ * fVar6 +
                                        fVar100 * local_2640._0_4_ + fVar72 * auVar95._0_4_));
            local_2520._4_4_ =
                 (float)(uVar102 ^
                        (uint)((float)local_2670._4_4_ * fVar9 +
                              fVar8 * local_2640._4_4_ + fVar7 * auVar95._4_4_));
            local_2520._8_4_ =
                 (float)(uVar103 ^
                        (uint)(fStack_2668 * fVar12 +
                              fVar11 * local_2640._8_4_ + fVar10 * auVar95._8_4_));
            local_2520._12_4_ =
                 (float)(uVar104 ^
                        (uint)(fStack_2664 * fVar15 +
                              fVar14 * local_2640._12_4_ + fVar13 * auVar95._12_4_));
            fVar63 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar70 = local_2510._0_4_;
            auVar66._0_4_ = fVar70 * fVar63;
            fVar71 = local_2510._4_4_;
            auVar66._4_4_ = fVar71 * fVar63;
            fVar72 = local_2510._8_4_;
            auVar66._8_4_ = fVar72 * fVar63;
            fVar100 = local_2510._12_4_;
            auVar66._12_4_ = fVar100 * fVar63;
            auVar73 = vcmpps_avx(auVar66,local_2520,1);
            fVar63 = (ray->super_RayK<1>).tfar;
            auVar82._0_4_ = fVar70 * fVar63;
            auVar82._4_4_ = fVar71 * fVar63;
            auVar82._8_4_ = fVar72 * fVar63;
            auVar82._12_4_ = fVar100 * fVar63;
            auVar91 = vcmpps_avx(local_2520,auVar82,2);
            auVar73 = vandps_avx(auVar91,auVar73);
            auVar91 = auVar94 & auVar73;
            if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar91[0xf] < '\0') {
              auVar3._0_4_ = (ray->super_RayK<1>).tfar;
              auVar3._4_4_ = (ray->super_RayK<1>).mask;
              auVar3._8_4_ = (ray->super_RayK<1>).id;
              auVar3._12_4_ = (ray->super_RayK<1>).flags;
              auVar98 = ZEXT1664(auVar3);
              auVar94 = vandps_avx(auVar94,auVar73);
              local_24f0 = auVar94;
              local_24b0[0] = (float)local_2670._0_4_;
              local_24b0[1] = (float)local_2670._4_4_;
              local_24b0[2] = fStack_2668;
              local_24b0[3] = fStack_2664;
              local_24a0 = local_2640._0_8_;
              uStack_2498 = local_2640._8_8_;
              local_2680 = auVar95._0_8_;
              uStack_2678 = auVar95._8_8_;
              local_2490 = local_2680;
              uStack_2488 = uStack_2678;
              local_25f0._0_8_ = context->scene;
              local_2630 = auVar94;
              auVar73 = vrcpps_avx(local_2510);
              fVar63 = auVar73._0_4_;
              auVar83._0_4_ = fVar70 * fVar63;
              fVar70 = auVar73._4_4_;
              auVar83._4_4_ = fVar71 * fVar70;
              fVar71 = auVar73._8_4_;
              auVar83._8_4_ = fVar72 * fVar71;
              fVar72 = auVar73._12_4_;
              auVar83._12_4_ = fVar100 * fVar72;
              auVar90._8_4_ = 0x3f800000;
              auVar90._0_8_ = 0x3f8000003f800000;
              auVar90._12_4_ = 0x3f800000;
              auVar73 = vsubps_avx(auVar90,auVar83);
              fVar63 = fVar63 + fVar63 * auVar73._0_4_;
              fVar70 = fVar70 + fVar70 * auVar73._4_4_;
              fVar71 = fVar71 + fVar71 * auVar73._8_4_;
              fVar72 = fVar72 + fVar72 * auVar73._12_4_;
              local_24c0._0_4_ = fVar63 * local_2520._0_4_;
              local_24c0._4_4_ = fVar70 * local_2520._4_4_;
              local_24c0._8_4_ = fVar71 * local_2520._8_4_;
              local_24c0._12_4_ = fVar72 * local_2520._12_4_;
              auVar69 = ZEXT1664(local_24c0);
              local_24e0[0] = fVar63 * local_2540._0_4_;
              local_24e0[1] = fVar70 * local_2540._4_4_;
              local_24e0[2] = fVar71 * local_2540._8_4_;
              local_24e0[3] = fVar72 * local_2540._12_4_;
              local_24d0[0] = fVar63 * local_2540._16_4_;
              local_24d0[1] = fVar70 * local_2540._20_4_;
              local_24d0[2] = fVar71 * local_2540._24_4_;
              local_24d0[3] = fVar72 * local_2540._28_4_;
              auVar67._8_4_ = 0x7f800000;
              auVar67._0_8_ = 0x7f8000007f800000;
              auVar67._12_4_ = 0x7f800000;
              auVar73 = vblendvps_avx(auVar67,local_24c0,auVar94);
              auVar95 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar95 = vminps_avx(auVar95,auVar73);
              auVar91 = vshufpd_avx(auVar95,auVar95,1);
              auVar95 = vminps_avx(auVar91,auVar95);
              auVar73 = vcmpps_avx(auVar73,auVar95,0);
              auVar95 = auVar94 & auVar73;
              if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar95[0xf] < '\0') {
                auVar94 = vandps_avx(auVar73,auVar94);
              }
              local_2670._0_4_ = vextractps_avx(auVar3,1);
              stack0xffffffffffffd994 = auVar85._4_12_;
              uVar51 = vmovmskps_avx(auVar94);
              uVar62 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar51);
              pbVar54 = (byte *)0x0;
              if (uVar62 != 0) {
                for (; (uVar62 >> (long)pbVar54 & 1) == 0; pbVar54 = pbVar54 + 1) {
                }
              }
              local_2640._0_8_ = lVar56 + uVar52;
              lVar56 = lVar56 + uVar52;
              do {
                local_2570 = auVar98._0_16_;
                local_2588 = *(uint *)(lVar56 + 0x90 + (long)pbVar54 * 4);
                lVar56 = *(long *)(*(long *)(local_25f0._0_8_ + 0x1e8) + (ulong)local_2588 * 8);
                if ((*(uint *)(lVar56 + 0x34) & local_2670._0_4_) == 0) {
                  *(undefined4 *)(local_2630 + (long)pbVar54 * 4) = 0;
                  uVar49 = local_2670._0_4_;
                }
                else {
                  local_2670 = (undefined1  [8])pbVar54;
                  local_2600._0_8_ = context->args;
                  local_2560 = auVar69._0_16_;
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    local_25c0 = context->user;
                    if (*(long *)(lVar56 + 0x40) == 0) {
                      fVar63 = local_24e0[(long)pbVar54];
                      fVar70 = local_24d0[(long)pbVar54];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)pbVar54 * 4);
                      (ray->Ng).field_0.field_0.x = local_24b0[(long)pbVar54];
                      (ray->Ng).field_0.field_0.y =
                           *(float *)((long)&local_24a0 + (long)pbVar54 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_2490 + (long)pbVar54 * 4);
                      ray->u = fVar63;
                      ray->v = fVar70;
                      ray->primID = *(uint *)(local_2640._0_8_ + 0xa0 + (long)pbVar54 * 4);
                      ray->geomID = local_2588;
                      ray->instID[0] = local_25c0->instID[0];
                      ray->instPrimID[0] = local_25c0->instPrimID[0];
                      break;
                    }
                    local_2618 = lVar53;
                    local_2610 = uVar59;
                    local_2608 = context;
                  }
                  else {
                    local_2618 = lVar53;
                    local_2610 = uVar59;
                    local_2608 = context;
                    local_25c0 = context->user;
                  }
                  local_25a0 = local_24b0[(long)pbVar54];
                  local_259c = *(undefined4 *)((long)&local_24a0 + (long)pbVar54 * 4);
                  local_2598 = *(undefined4 *)((long)&local_2490 + (long)pbVar54 * 4);
                  local_2594 = local_24e0[(long)pbVar54];
                  local_2590 = local_24d0[(long)pbVar54];
                  local_258c = *(undefined4 *)(local_2640._0_8_ + 0xa0 + (long)pbVar54 * 4);
                  local_2584 = local_25c0->instID[0];
                  local_2580 = local_25c0->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)pbVar54 * 4);
                  local_2654 = -1;
                  local_25d0 = &local_2654;
                  pbVar55 = *(byte **)(lVar56 + 0x18);
                  local_25c8 = pbVar55;
                  local_25b8 = ray;
                  local_25b0 = &local_25a0;
                  local_25a8 = 1;
                  local_2650._0_8_ = lVar56;
                  local_2618 = lVar53;
                  local_2610 = uVar59;
                  local_2608 = context;
                  if ((*(code **)(lVar56 + 0x40) == (code *)0x0) ||
                     ((**(code **)(lVar56 + 0x40))(&local_25d0), *local_25d0 != 0)) {
                    if ((*(code **)(local_2600._0_8_ + 0x10) != (code *)0x0) &&
                       (((pbVar55 = (byte *)local_2600._0_8_, (*(byte *)local_2600._0_8_ & 2) != 0
                         || (pbVar55 = (byte *)local_2650._0_8_,
                            (*(byte *)(local_2650._0_8_ + 0x3e) & 0x40) != 0)) &&
                        ((**(code **)(local_2600._0_8_ + 0x10))(&local_25d0), *local_25d0 == 0))))
                    goto LAB_00e52fbf;
                    (local_25b8->Ng).field_0.field_0.x = *local_25b0;
                    (local_25b8->Ng).field_0.field_0.y = local_25b0[1];
                    (local_25b8->Ng).field_0.field_0.z = local_25b0[2];
                    local_25b8->u = local_25b0[3];
                    local_25b8->v = local_25b0[4];
                    local_25b8->primID = (uint)local_25b0[5];
                    local_25b8->geomID = (uint)local_25b0[6];
                    local_25b8->instID[0] = (uint)local_25b0[7];
                    pbVar55 = (byte *)0x0;
                    local_25b8->instPrimID[0] = (uint)local_25b0[8];
                  }
                  else {
LAB_00e52fbf:
                    (ray->super_RayK<1>).tfar = (float)local_2570._0_4_;
                  }
                  *(undefined4 *)(local_2630 + (long)pbVar54 * 4) = 0;
                  fVar63 = (ray->super_RayK<1>).tfar;
                  auVar68._4_4_ = fVar63;
                  auVar68._0_4_ = fVar63;
                  auVar68._8_4_ = fVar63;
                  auVar68._12_4_ = fVar63;
                  auVar69 = ZEXT1664(local_2560);
                  auVar94 = vcmpps_avx(local_2560,auVar68,2);
                  local_2630 = vandps_avx(auVar94,local_2630);
                  auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                  auVar4._4_4_ = (ray->super_RayK<1>).mask;
                  auVar4._8_4_ = (ray->super_RayK<1>).id;
                  auVar4._12_4_ = (ray->super_RayK<1>).flags;
                  auVar98 = ZEXT1664(auVar4);
                  uVar49 = vextractps_avx(auVar4,1);
                  pbVar54 = pbVar55;
                  context = local_2608;
                  lVar53 = local_2618;
                  uVar59 = local_2610;
                }
                if ((((local_2630 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2630 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2630 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2630[0xf]) break;
                auVar84._8_4_ = 0x7f800000;
                auVar84._0_8_ = 0x7f8000007f800000;
                auVar84._12_4_ = 0x7f800000;
                auVar94 = vblendvps_avx(auVar84,auVar69._0_16_,local_2630);
                auVar73 = vshufps_avx(auVar94,auVar94,0xb1);
                auVar73 = vminps_avx(auVar73,auVar94);
                auVar85 = vshufpd_avx(auVar73,auVar73,1);
                auVar73 = vminps_avx(auVar85,auVar73);
                auVar73 = vcmpps_avx(auVar94,auVar73,0);
                auVar85 = local_2630 & auVar73;
                auVar94 = local_2630;
                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar85[0xf] < '\0') {
                  auVar94 = vandps_avx(auVar73,local_2630);
                }
                uVar51 = vmovmskps_avx(auVar94);
                uVar62 = CONCAT44((int)((ulong)pbVar54 >> 0x20),uVar51);
                pbVar54 = (byte *)0x0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> (long)pbVar54 & 1) == 0; pbVar54 = pbVar54 + 1) {
                  }
                }
                local_2670._0_4_ = uVar49;
                lVar56 = local_2640._0_8_;
              } while( true );
            }
          }
          auVar98 = ZEXT3264(local_23c0);
          auVar99 = ZEXT3264(local_23e0);
          auVar101 = ZEXT3264(local_2400);
          auVar105 = ZEXT3264(local_2420);
          auVar106 = ZEXT3264(local_2440);
          auVar111 = ZEXT3264(local_2460);
          auVar112 = ZEXT3264(local_2480);
        }
        fVar63 = (ray->super_RayK<1>).tfar;
        auVar69 = ZEXT3264(CONCAT428(fVar63,CONCAT424(fVar63,CONCAT420(fVar63,CONCAT416(fVar63,
                                                  CONCAT412(fVar63,CONCAT48(fVar63,CONCAT44(fVar63,
                                                  fVar63))))))));
      }
      goto LAB_00e525f6;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }